

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O3

void __thiscall
iutest::detail::
TypeParamTestInstance<iu_TypedTest_x_iutest_x_Equal_Test,_iutest::detail::VariadicTypeList<int,_long,_short>_>
::EachTest<iutest::detail::VariadicTypeList<int,_long,_short>,_void>::AddTest
          (EachTest<iutest::detail::VariadicTypeList<int,_long,_short>,_void> *this)

{
  TestSuite *this_00;
  UnitTest *pUVar1;
  
  pUVar1 = UnitTest::instance();
  this_00 = (this->m_mediator).super_iuITestSuiteMediator.m_test_suite;
  (pUVar1->super_UnitTestImpl).m_total_test_num = (pUVar1->super_UnitTestImpl).m_total_test_num + 1;
  TestSuite::push_back(this_00,&this->m_info);
  EachTest<iutest::detail::VariadicTypeList<long,_short>,_void>::AddTest(&this->m_next);
  return;
}

Assistant:

void AddTest()
        {
            // 順番通りになるように前から登録
            UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
            m_next.AddTest();
        }